

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O1

void __thiscall
Statsd::StatsdClient::StatsdClient
          (StatsdClient *this,string *host,uint16_t port,string *prefix,uint64_t batchsize,
          uint64_t sendInterval,int gaugePrecision)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  UDPSender *this_00;
  long lVar4;
  ulong uVar5;
  char *local_13d8;
  size_type local_13d0;
  char local_13c8;
  undefined7 uStack_13c7;
  undefined8 uStack_13c0;
  random_device local_13b8;
  
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_13d8 = &local_13c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_13d8,pcVar2,pcVar2 + prefix->_M_string_length);
  if ((local_13d0 != 0) && (local_13d8[local_13d0 - 1] == '.')) {
    std::__cxx11::string::pop_back();
  }
  paVar1 = &(this->m_prefix).field_2;
  (this->m_prefix)._M_dataplus._M_p = (pointer)paVar1;
  if (local_13d8 == &local_13c8) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_13c7,local_13c8);
    *(undefined8 *)((long)&(this->m_prefix).field_2 + 8) = uStack_13c0;
  }
  else {
    (this->m_prefix)._M_dataplus._M_p = local_13d8;
    (this->m_prefix).field_2._M_allocated_capacity = CONCAT71(uStack_13c7,local_13c8);
  }
  (this->m_prefix)._M_string_length = local_13d0;
  local_13d0 = 0;
  local_13c8 = '\0';
  local_13d8 = &local_13c8;
  this_00 = (UDPSender *)operator_new(0xf0);
  UDPSender::UDPSender(this_00,host,port,batchsize,sendInterval);
  (this->m_sender)._M_t.
  super___uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>._M_t.
  super__Tuple_impl<0UL,_Statsd::UDPSender_*,_std::default_delete<Statsd::UDPSender>_>.
  super__Head_base<0UL,_Statsd::UDPSender_*,_false>._M_head_impl = this_00;
  (this->m_randomEngine)._M_x[0] = 0x1571;
  uVar5 = 0x1571;
  lVar4 = 6;
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4) - 5);
    (this->m_randomEngine)._M_x[lVar4 + -5] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x275);
  (this->m_randomEngine)._M_p = 0x270;
  this->m_gaugePrecision = gaugePrecision;
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  uVar5 = (ulong)uVar3;
  (this->m_randomEngine)._M_x[0] = uVar5;
  lVar4 = 6;
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4) - 5);
    (this->m_randomEngine)._M_x[lVar4 + -5] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x275);
  (this->m_randomEngine)._M_p = 0x270;
  std::random_device::_M_fini();
  return;
}

Assistant:

inline StatsdClient::StatsdClient(const std::string& host,
                                  const uint16_t port,
                                  const std::string& prefix,
                                  const uint64_t batchsize,
                                  const uint64_t sendInterval,
                                  const int gaugePrecision) noexcept
    : m_prefix(detail::sanitizePrefix(prefix)),
      m_sender(new UDPSender{host, port, batchsize, sendInterval}),
      m_gaugePrecision(gaugePrecision) {
    // Initialize the random generator to be used for sampling
    seed();
}